

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

Move * move_dup(Move *move)

{
  Move *movePack;
  MovePack *pMVar1;
  long in_RDI;
  int unaff_retaddr;
  uchar unaff_retaddr_00;
  SPOTTYPE unaff_retaddr_01;
  MOVETYPE unaff_retaddr_02;
  Move *dupMove;
  
  movePack = move_create(unaff_retaddr_02,unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,
                         (SPOTTYPE)((ulong)in_RDI >> 0x38),(uchar)((ulong)in_RDI >> 0x30),(int)move)
  ;
  if (*(long *)(in_RDI + 0x10) != 0) {
    pMVar1 = movePack_dup((MovePack *)movePack);
    movePack->movePack = pMVar1;
  }
  return movePack;
}

Assistant:

Move * move_dup(Move * move)
{
	Move * dupMove = move_create(move->type, move->fromSpotType, move->fromSpotIndex, move->fromSpotCardIndex, move->toSpotType, move->toSpotIndex, move->toSpotCardIndex);
	if(move->movePack!=0)
		dupMove->movePack = movePack_dup(move->movePack);
	return dupMove;
}